

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondStamp.cpp
# Opt level: O1

void __thiscall OpenMD::BondStamp::~BondStamp(BondStamp *this)

{
  ~BondStamp(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

BondStamp::~BondStamp() {}